

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O3

int SetInitialProfile(UserData data,N_Vector uu,N_Vector up,N_Vector res)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  sunrealtype sVar7;
  double dVar8;
  double dVar9;
  
  lVar1 = data->mm;
  lVar3 = N_VGetArrayPointer(uu);
  lVar4 = N_VGetArrayPointer(up);
  if (0 < lVar1) {
    lVar5 = 0;
    do {
      dVar8 = (double)lVar5 * data->dx;
      lVar6 = 0;
      do {
        dVar9 = (double)lVar6 * data->dx;
        *(double *)(lVar3 + lVar6 * 8) = (1.0 - dVar9) * dVar9 * 16.0 * dVar8 * (1.0 - dVar8);
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + lVar1 * 8;
    } while (lVar5 != lVar1);
    sVar7 = (sunrealtype)N_VConst(0,up);
    resHeat(sVar7,uu,up,res,data);
    lVar3 = N_VScale(0xbff0000000000000,res,up);
    if (0 < lVar1) {
      lVar3 = 0;
      do {
        lVar5 = 0;
        do {
          if ((((lVar3 == 0) || (lVar1 + -1 == lVar5)) || (lVar3 == lVar1 + -1)) || (lVar5 == 0)) {
            *(undefined8 *)(lVar4 + lVar5 * 8) = 0;
          }
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + lVar1 * 8;
      } while (lVar3 != lVar1);
    }
    return (int)lVar3;
  }
  sVar7 = (sunrealtype)N_VConst(0,up);
  resHeat(sVar7,uu,up,res,data);
  iVar2 = N_VScale(0xbff0000000000000,res,up);
  return iVar2;
}

Assistant:

static int SetInitialProfile(UserData data, N_Vector uu, N_Vector up, N_Vector res)
{
  sunindextype mm, mm1, i, j, offset, loc;
  sunrealtype xfact, yfact, *udata, *updata;

  mm = data->mm;

  udata  = N_VGetArrayPointer(uu);
  updata = N_VGetArrayPointer(up);

  /* Initialize uu on all grid points. */
  mm1 = mm - 1;
  for (j = 0; j < mm; j++)
  {
    yfact  = data->dx * j;
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      xfact      = data->dx * i;
      loc        = offset + i;
      udata[loc] = SUN_RCONST(16.0) * xfact * (ONE - xfact) * yfact *
                   (ONE - yfact);
    }
  }

  /* Initialize up vector to 0. */
  N_VConst(ZERO, up);

  /* resHeat sets res to negative of ODE RHS values at interior points. */
  resHeat(ZERO, uu, up, res, data);

  /* Copy -res into up to get correct interior initial up values. */
  N_VScale(-ONE, res, up);

  /* Set up at boundary points to zero. */
  for (j = 0; j < mm; j++)
  {
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      loc = offset + i;
      if (j == 0 || j == mm1 || i == 0 || i == mm1) { updata[loc] = ZERO; }
    }
  }

  return (0);
}